

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll_set.cpp
# Opt level: O2

__sighandler_t __thiscall miniros::PollSet::signal(PollSet *this,int __sig,__sighandler_t __handler)

{
  bool bVar1;
  int iVar2;
  undefined7 extraout_var;
  undefined4 extraout_var_00;
  lock_guard<std::mutex> lock;
  char b;
  undefined1 local_19;
  size_t local_18;
  __sighandler_t p_Var3;
  
  bVar1 = std::mutex::try_lock(&this->signal_mutex_);
  p_Var3 = (__sighandler_t)CONCAT71(extraout_var,bVar1);
  if (bVar1) {
    local_19 = 0;
    local_18 = 1;
    write_signal(this->signal_pipe_ + 1,&local_19,&local_18);
    iVar2 = pthread_mutex_unlock((pthread_mutex_t *)&this->signal_mutex_);
    p_Var3 = (__sighandler_t)CONCAT44(extraout_var_00,iVar2);
  }
  return p_Var3;
}

Assistant:

void PollSet::signal()
{
  if (signal_mutex_.try_lock())
  {
    std::lock_guard<std::mutex> lock(signal_mutex_, std::adopt_lock);
    char b = 0;
    if (write_signal(signal_pipe_[1], &b, 1) < 0)
    {
      // do nothing... this prevents warnings on gcc 4.3
    }
  }
}